

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O1

void __thiscall
WordSplitSVTest_empty_Test<char16_t>::TestBody(WordSplitSVTest_empty_Test<char16_t> *this)

{
  pointer *__ptr_2;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  long *local_68;
  AssertHelper local_60 [8];
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  long *local_48 [2];
  long local_38 [2];
  container_type_conflict4 local_28;
  
  jessilib::word_split<std::vector,_const_char16_t_*,_const_char16_t_*,_char16_t>
            (&local_28,(char16_t *)0x0,(char16_t *)0x0,L'\0');
  local_58[0] = local_28.
                super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_28.
                super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_48,local_58,"split_result.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x40,(char *)local_48[0]);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, empty) {
	std::basic_string_view<TypeParam> empty;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(empty, default_delim<TypeParam>);
	EXPECT_TRUE(split_result.empty());
}